

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  LogMessage *pLVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  LogFinisher local_101;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var6->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < number]) {
    if (number <= (int)p_Var7[1]._M_color) {
      p_Var4 = p_Var7;
    }
  }
  p_Var7 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var6) && (p_Var7 = p_Var4, number < (int)p_Var4[1]._M_color))
  {
    p_Var7 = &p_Var6->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var6) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x248);
    pLVar5 = LogMessage::operator<<(&local_90,"CHECK failed: iter != extensions_.end(): ");
    pLVar5 = LogMessage::operator<<(pLVar5,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar5);
    LogMessage::~LogMessage(&local_90);
  }
  if (*(char *)((long)&p_Var7[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x24b);
    pLVar5 = LogMessage::operator<<(&local_c8,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar5);
    LogMessage::~LogMessage(&local_c8);
  }
  bVar1 = *(byte *)&p_Var7[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar5 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar5);
    LogMessage::~LogMessage(&local_58);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
LAB_00167476:
      LogMessage::~LogMessage(&local_100);
    }
    break;
  case 2:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 3:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 4:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 5:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 6:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 7:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 8:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      goto LAB_00167476;
    }
    break;
  case 9:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x352);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      LogMessage::~LogMessage(&local_100);
    }
    iVar2 = *(int *)&p_Var7->_M_parent;
    *(int *)&p_Var7->_M_parent = iVar2 + -1;
    puVar3 = *(undefined8 **)(*(long *)p_Var7 + -8 + (long)iVar2 * 8);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
    return;
  case 10:
    p_Var7 = p_Var7[1]._M_parent;
    if (*(int *)&p_Var7->_M_parent < 1) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x352);
      pLVar5 = LogMessage::operator<<(&local_100,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_101,pLVar5);
      LogMessage::~LogMessage(&local_100);
    }
    iVar2 = *(int *)&p_Var7->_M_parent;
    *(int *)&p_Var7->_M_parent = iVar2 + -1;
    (**(code **)(**(long **)(*(long *)p_Var7 + -8 + (long)iVar2 * 8) + 0x20))();
  default:
    goto switchD_00167197_default;
  }
  *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + -1;
switchD_00167197_default:
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}